

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * __thiscall
httplib::detail::random_string_abi_cxx11_(string *__return_storage_ptr__,detail *this,size_t length)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (__return_storage_ptr__,(size_type)this,'\0');
  std::
  generate_n<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,httplib::detail::random_string(unsigned_long)::_lambda()_1_>
            ((__return_storage_ptr__->_M_dataplus)._M_p,this);
  return __return_storage_ptr__;
}

Assistant:

inline std::string random_string(size_t length) {
  auto randchar = []() -> char {
    const char charset[] = "0123456789"
                           "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                           "abcdefghijklmnopqrstuvwxyz";
    const size_t max_index = (sizeof(charset) - 1);
    return charset[static_cast<size_t>(std::rand()) % max_index];
  };
  std::string str(length, 0);
  std::generate_n(str.begin(), length, randchar);
  return str;
}